

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3c4::NinjaMain::NinjaMain
          (NinjaMain *this,char *ninja_command,BuildConfig *config)

{
  int64_t iVar1;
  BuildConfig *config_local;
  char *ninja_command_local;
  NinjaMain *this_local;
  
  BuildLogUser::BuildLogUser(&this->super_BuildLogUser);
  (this->super_BuildLogUser)._vptr_BuildLogUser = (_func_int **)&PTR_IsPathDead_001926a0;
  this->ninja_command_ = ninja_command;
  this->config_ = config;
  State::State(&this->state_);
  RealDiskInterface::RealDiskInterface(&this->disk_interface_);
  std::__cxx11::string::string((string *)&this->build_dir_);
  BuildLog::BuildLog(&this->build_log_);
  DepsLog::DepsLog(&this->deps_log_);
  iVar1 = GetTimeMillis();
  this->start_time_millis_ = iVar1;
  return;
}

Assistant:

NinjaMain(const char* ninja_command, const BuildConfig& config) :
      ninja_command_(ninja_command), config_(config),
      start_time_millis_(GetTimeMillis()) {}